

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

void fdb_file_handle_add_cmp_func
               (fdb_file_handle *fhandle,char *kvs_name,fdb_custom_cmp_variable cmp_func,
               void *cmp_func_user_param)

{
  list *plVar1;
  undefined8 *puVar2;
  size_t sVar3;
  char *__dest;
  
  if (fhandle->cmp_func_list == (list *)0x0) {
    plVar1 = (list *)calloc(1,0x10);
    fhandle->cmp_func_list = plVar1;
    plVar1->head = (list_elem *)0x0;
    plVar1->tail = (list_elem *)0x0;
  }
  puVar2 = (undefined8 *)calloc(1,0x28);
  if (kvs_name == (char *)0x0) {
    *puVar2 = 0;
  }
  else {
    sVar3 = strlen(kvs_name);
    __dest = (char *)calloc(1,sVar3 + 1);
    *puVar2 = __dest;
    strcpy(__dest,kvs_name);
  }
  puVar2[1] = cmp_func;
  puVar2[2] = cmp_func_user_param;
  list_push_back(fhandle->cmp_func_list,(list_elem *)(puVar2 + 3));
  return;
}

Assistant:

void fdb_file_handle_add_cmp_func(fdb_file_handle* fhandle,
                                  char* kvs_name,
                                  fdb_custom_cmp_variable cmp_func,
                                  void* cmp_func_user_param)
{
    struct cmp_func_node *node;

    // create list if not exist
    if (!fhandle->cmp_func_list) {
        fhandle->cmp_func_list = (struct list*)calloc(1, sizeof(struct list));
        list_init(fhandle->cmp_func_list);
    }

    node = (struct cmp_func_node*)calloc(1, sizeof(struct cmp_func_node));
    if (kvs_name) {
        node->kvs_name = (char*)calloc(1, strlen(kvs_name)+1);
        strcpy(node->kvs_name, kvs_name);
    } else {
        // default KVS
        node->kvs_name = NULL;
    }
    node->func = cmp_func;
    node->user_param = cmp_func_user_param;
    list_push_back(fhandle->cmp_func_list, &node->le);
}